

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int s_mp_sqr(mp_int *a,mp_int *b)

{
  ulong *puVar1;
  uint uVar2;
  mp_digit *pmVar3;
  mp_digit mVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint size;
  ulong uVar18;
  ulong *puVar19;
  mp_int t;
  mp_int local_68;
  mp_int *local_50;
  mp_int local_48;
  
  uVar2 = a->used;
  uVar16 = (ulong)uVar2;
  size = uVar2 * 2 + 1;
  iVar11 = mp_init_size(&local_68,size);
  if (iVar11 == 0) {
    local_68.used = size;
    if (0 < (int)uVar2) {
      pmVar3 = a->dp;
      uVar17 = 1;
      uVar18 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pmVar3[uVar18];
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pmVar3[uVar18];
        uVar12 = SUB168(auVar5 * auVar7,0);
        puVar1 = local_68.dp + uVar18 * 2;
        puVar19 = puVar1 + 1;
        uVar13 = uVar12 + *puVar1;
        uVar12 = (SUB168(auVar5 * auVar7,8) + (ulong)CARRY8(uVar12,*puVar1)) * 0x10 | uVar13 >> 0x3c
        ;
        *puVar1 = uVar13 & 0xfffffffffffffff;
        uVar13 = uVar18 + 1;
        if (uVar13 < uVar16) {
          mVar4 = pmVar3[uVar18];
          uVar18 = uVar17;
          do {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = mVar4 * 2;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = pmVar3[uVar18];
            uVar14 = SUB168(auVar6 * auVar8,0);
            uVar15 = uVar12 + *puVar19 + uVar14;
            uVar12 = ((ulong)CARRY8(uVar12,*puVar19) +
                      SUB168(auVar6 * auVar8,8) + -((long)mVar4 >> 0x3f) * pmVar3[uVar18] +
                     (ulong)CARRY8(uVar12 + *puVar19,uVar14)) * 0x10 | uVar15 >> 0x3c;
            *puVar19 = uVar15 & 0xfffffffffffffff;
            puVar19 = puVar19 + 1;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        for (; uVar12 != 0; uVar12 = uVar12 + uVar14 >> 0x3c | (ulong)CARRY8(uVar12,uVar18) << 4) {
          uVar18 = *puVar19;
          uVar14 = *puVar19;
          *puVar19 = uVar12 + uVar14 & 0xfffffffffffffff;
          puVar19 = puVar19 + 1;
        }
        uVar17 = uVar17 + 1;
        uVar18 = uVar13;
      } while (uVar13 != uVar16);
    }
    if ((-1 < (int)uVar2) && (local_68.dp[(ulong)size - 1] == 0)) {
      uVar16 = (ulong)(uVar2 * 2);
      local_68.used = uVar2 * 2 + 1;
      do {
        if (local_68.used < 2) {
          local_68.used = 0;
          break;
        }
        uVar18 = uVar16 & 0xffffffff;
        local_68.used = local_68.used + -1;
        uVar16 = uVar16 - 1;
      } while (local_68.dp[uVar18 - 1] == 0);
      if (local_68.used == 0) {
        local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
      }
    }
    local_48.dp = local_68.dp;
    local_48.used = local_68.used;
    local_48.alloc = local_68.alloc;
    local_48.sign = local_68.sign;
    local_48._12_4_ = local_68._12_4_;
    pmVar3 = b->dp;
    uVar9._0_4_ = b->used;
    uVar9._4_4_ = b->alloc;
    uVar10._0_4_ = b->sign;
    uVar10._4_4_ = *(undefined4 *)&b->field_0xc;
    b->used = local_68.used;
    b->alloc = local_68.alloc;
    b->sign = local_68.sign;
    *(undefined4 *)&b->field_0xc = local_68._12_4_;
    b->dp = local_68.dp;
    if (pmVar3 == (mp_digit *)0x0) {
      iVar11 = 0;
    }
    else {
      local_68._0_8_ = uVar9;
      local_68._8_8_ = uVar10;
      local_68.dp = pmVar3;
      local_50 = b;
      if (0 < (long)(int)uVar9) {
        memset(pmVar3,0,(long)(int)uVar9 << 3);
      }
      free(pmVar3);
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int s_mp_sqr (mp_int * a, mp_int * b)
{
  mp_int  t;
  int     res, ix, iy, pa;
  mp_word r;
  mp_digit u, tmpx, *tmpt;

  pa = a->used;
  if ((res = mp_init_size (&t, 2*pa + 1)) != MP_OKAY) {
    return res;
  }

  /* default used is maximum possible size */
  t.used = 2*pa + 1;

  for (ix = 0; ix < pa; ix++) {
    /* first calculate the digit at 2*ix */
    /* calculate double precision result */
    r = ((mp_word) t.dp[2*ix]) +
        ((mp_word)a->dp[ix])*((mp_word)a->dp[ix]);

    /* store lower part in result */
    t.dp[ix+ix] = (mp_digit) (r & ((mp_word) MP_MASK));

    /* get the carry */
    u           = (mp_digit)(r >> ((mp_word) DIGIT_BIT));

    /* left hand side of A[ix] * A[iy] */
    tmpx        = a->dp[ix];

    /* alias for where to store the results */
    tmpt        = t.dp + (2*ix + 1);
    
    for (iy = ix + 1; iy < pa; iy++) {
      /* first calculate the product */
      r       = ((mp_word)tmpx) * ((mp_word)a->dp[iy]);

      /* now calculate the double precision result, note we use
       * addition instead of *2 since it's easier to optimize
       */
      r       = ((mp_word) *tmpt) + r + r + ((mp_word) u);

      /* store lower part */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get carry */
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
    /* propagate upwards */
    while (u != ((mp_digit) 0)) {
      r       = ((mp_word) *tmpt) + ((mp_word) u);
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
  }

  mp_clamp (&t);
  mp_exch (&t, b);
  mp_clear (&t);
  return MP_OKAY;
}